

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundStatement.cpp
# Opt level: O2

void __thiscall hdc::CompoundStatement::~CompoundStatement(CompoundStatement *this)

{
  pointer ppSVar1;
  Statement *pSVar2;
  int i;
  ulong uVar3;
  
  (this->super_Statement).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_0019bff0;
  uVar3 = 0;
  while( true ) {
    ppSVar1 = (this->statements).
              super__Vector_base<hdc::Statement_*,_std::allocator<hdc::Statement_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->statements).
                      super__Vector_base<hdc::Statement_*,_std::allocator<hdc::Statement_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <= uVar3)
    break;
    pSVar2 = ppSVar1[uVar3];
    if (pSVar2 != (Statement *)0x0) {
      (*(pSVar2->super_ASTNode)._vptr_ASTNode[2])();
    }
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<hdc::Statement_*,_std::allocator<hdc::Statement_*>_>::~_Vector_base
            (&(this->statements).
              super__Vector_base<hdc::Statement_*,_std::allocator<hdc::Statement_*>_>);
  Statement::~Statement(&this->super_Statement);
  return;
}

Assistant:

CompoundStatement::~CompoundStatement() {
    for (int i = 0; i < statements.size(); ++i) {
        delete statements[i];
    }
}